

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::SwapSlow(UnknownFieldSet *this,UnknownFieldSet *other)

{
  undefined1 local_28 [8];
  UnknownFieldSet tmp;
  UnknownFieldSet *other_local;
  UnknownFieldSet *this_local;
  
  tmp.fields_.soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)other;
  UnknownFieldSet((UnknownFieldSet *)local_28);
  MergeFrom((UnknownFieldSet *)local_28,this);
  Clear(this);
  MergeFrom(this,(UnknownFieldSet *)tmp.fields_.soo_rep_.field_0.short_rep.field_1);
  Clear((UnknownFieldSet *)tmp.fields_.soo_rep_.field_0.short_rep.field_1);
  MergeFrom((UnknownFieldSet *)tmp.fields_.soo_rep_.field_0.short_rep.field_1,
            (UnknownFieldSet *)local_28);
  ~UnknownFieldSet((UnknownFieldSet *)local_28);
  return;
}

Assistant:

void UnknownFieldSet::SwapSlow(UnknownFieldSet* other) {
  UnknownFieldSet tmp;
  tmp.MergeFrom(*this);
  this->Clear();
  this->MergeFrom(*other);
  other->Clear();
  other->MergeFrom(tmp);
}